

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O1

void google::FlushLogFilesUnsafe(LogSeverity min_severity)

{
  long lVar1;
  int i;
  
  if (min_severity < 4) {
    lVar1 = (long)min_severity;
    do {
      lVar1 = lVar1 + 1;
      if (*(LogFileObject **)(&LogDestination::terminal_supports_color_ + lVar1 * 8) !=
          (LogFileObject *)0x0) {
        anon_unknown_10::LogFileObject::FlushUnlocked
                  (*(LogFileObject **)(&LogDestination::terminal_supports_color_ + lVar1 * 8));
      }
    } while ((int)lVar1 != 4);
  }
  return;
}

Assistant:

inline void LogDestination::FlushLogFilesUnsafe(int min_severity) {
  // assume we have the log_mutex or we simply don't care
  // about it
  for (int i = min_severity; i < NUM_SEVERITIES; i++) {
    LogDestination* log = log_destinations_[i];
    if (log != NULL) {
      // Flush the base fileobject_ logger directly instead of going
      // through any wrappers to reduce chance of deadlock.
      log->fileobject_.FlushUnlocked();
    }
  }
}